

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCallSimplifierVisitor.cpp
# Opt level: O0

void __thiscall
IRT::CCallSimplifierVisitor::Visit(CCallSimplifierVisitor *this,CCallExpression *expression)

{
  CExpressionList *pCVar1;
  CCallExpression *this_00;
  CMoveStatement *this_01;
  CTempExpression *pCVar2;
  CEseqExpression *this_02;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a0;
  undefined1 local_91;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_90;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_88;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_80;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_78;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> moveStm;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_68;
  undefined1 local_60 [32];
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> callExp;
  CTemp temp;
  CCallExpression *expression_local;
  CCallSimplifierVisitor *this_local;
  
  pCVar1 = CCallExpression::getArguments(expression);
  (**(pCVar1->super_IExpression).super_INode._vptr_INode)(pCVar1,this);
  CTemp::CTemp((CTemp *)&callExp);
  this_00 = (CCallExpression *)operator_new(0x18);
  moveStm._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 1;
  CCallExpression::getFunction(expression);
  CNameExpression::CopyCast((CNameExpression *)local_60);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
              *)(local_60 + 8),
             (unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
              *)local_60);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  unique_ptr(&local_68,&this->childExpressionList);
  CCallExpression::CCallExpression
            (this_00,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                      *)(local_60 + 8),&local_68);
  moveStm._M_t.
  super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
  super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 0;
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_40,(pointer)this_00);
  std::unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>::
  ~unique_ptr(&local_68);
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  ~unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
               *)(local_60 + 8));
  std::unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>::
  ~unique_ptr((unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
               *)local_60);
  this_01 = (CMoveStatement *)operator_new(0x18);
  local_91 = 1;
  pCVar2 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar2,(CTemp *)&callExp);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_88,(pointer)pCVar2);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_80,&local_88);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_90,&local_40);
  CMoveStatement::CMoveStatement(this_01,&local_80,&local_90);
  local_91 = 0;
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_78,(pointer)this_01);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_90);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_80);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_88);
  this_02 = (CEseqExpression *)operator_new(0x18);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_a8,&local_78);
  pCVar2 = (CTempExpression *)operator_new(0x28);
  CTempExpression::CTempExpression(pCVar2,(CTemp *)&callExp);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_b8,(pointer)pCVar2);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_b0,&local_b8);
  CEseqExpression::CEseqExpression(this_02,&local_a8,&local_b0);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_a0,(pointer)this_02);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::operator=
            (&this->childExpression,&local_a0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_a0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_b0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_b8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_a8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_78);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_40);
  CTemp::~CTemp((CTemp *)&callExp);
  return;
}

Assistant:

void IRT::CCallSimplifierVisitor::Visit(const CCallExpression &expression) {
    expression.getArguments()->Accept(*this);

    CTemp temp;

    std::unique_ptr<const CExpression> callExp = std::unique_ptr<const CExpression>(
            new CCallExpression(
                    std::move(expression.getFunction()->CopyCast()),
                    std::move(childExpressionList)
            )
    );

    std::unique_ptr<const CStatement> moveStm = std::unique_ptr<const CStatement>(
            new CMoveStatement(
                    std::move(std::unique_ptr<const CExpression>(new CTempExpression(temp))),
                    std::move(callExp)
            )
    );

    childExpression = std::move(
            std::unique_ptr<const CExpression>(
                new CEseqExpression(
                    std::move(moveStm),
                    std::move(std::unique_ptr<const CExpression>(new CTempExpression(temp)))
                )
            )
    );
}